

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexSets.cpp
# Opt level: O0

void __thiscall
TasGrid::MultiIndexSet::removeIndex(MultiIndexSet *this,vector<int,_std::allocator<int>_> *p)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  const_iterator local_40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  const_iterator local_28;
  int local_1c;
  vector<int,_std::allocator<int>_> *pvStack_18;
  int slot;
  vector<int,_std::allocator<int>_> *p_local;
  MultiIndexSet *this_local;
  
  pvStack_18 = p;
  p_local = (vector<int,_std::allocator<int>_> *)this;
  local_1c = getSlot(this,p);
  if (-1 < local_1c) {
    local_38._M_current = (int *)::std::vector<int,_std::allocator<int>_>::begin(&this->indexes);
    local_30 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&local_38,(long)local_1c * this->num_dimensions);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_28,
               &local_30);
    local_58._M_current = (int *)::std::vector<int,_std::allocator<int>_>::begin(&this->indexes);
    local_50 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&local_58,(long)local_1c * this->num_dimensions);
    local_48 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&local_50,this->num_dimensions);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_40,
               &local_48);
    ::std::vector<int,_std::allocator<int>_>::erase(&this->indexes,local_28,local_40);
    this->cache_num_indexes = this->cache_num_indexes + -1;
  }
  return;
}

Assistant:

void MultiIndexSet::removeIndex(const std::vector<int> &p){
    int slot = getSlot(p);
    if (slot > -1){
        indexes.erase(indexes.begin() + static_cast<size_t>(slot) * num_dimensions, indexes.begin() + static_cast<size_t>(slot) * num_dimensions + num_dimensions);
        cache_num_indexes--;
    }
}